

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall QTabWidget::initStyleOption(QTabWidget *this,QStyleOptionTabWidgetFrame *option)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  TabPosition TVar4;
  QTabWidgetPrivate *this_00;
  QStyle *pQVar5;
  QSize QVar6;
  QRect *this_01;
  long in_RSI;
  QStyleOptionTabWidgetFrame *in_RDI;
  long in_FS_OFFSET;
  QRect QVar7;
  int exth;
  QTabWidgetPrivate *d;
  QRect selectedTabRect;
  QSize bounds_1;
  QSize leftCornerSizeHint;
  QSize bounds;
  QSize rightCornerSizeHint;
  QSize t;
  QWidget *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QStyleOptionTabWidgetFrame *this_02;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_38;
  undefined1 *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    this_02 = in_RDI;
    this_00 = d_func((QTabWidget *)0x6e5c67);
    QTabWidgetPrivate::initBasicStyleOption
              ((QTabWidgetPrivate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_RDI);
    pQVar5 = QWidget::style(in_stack_ffffffffffffff48);
    uVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x16,0,in_RDI);
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QFrame::frameWidth((QFrame *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
    bVar2 = QWidget::isVisibleTo
                      ((QWidget *)this_00,(QWidget *)CONCAT44(uVar3,in_stack_ffffffffffffff60));
    if (bVar2) {
      local_10 = (undefined1 *)(**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
      bVar2 = documentMode((QTabWidget *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (bVar2) {
        TVar4 = tabPosition((QTabWidget *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        if ((TVar4 == East) ||
           (TVar4 = tabPosition((QTabWidget *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)),
           TVar4 == West)) {
          QWidget::height((QWidget *)0x6e5d53);
          QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        }
        else {
          QWidget::width((QWidget *)0x6e5d6e);
          QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        }
      }
    }
    if ((this_00->rightCornerWidget == (QWidget *)0x0) ||
       (bVar2 = QWidget::isVisible((QWidget *)0x6e5da5), !bVar2)) {
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
      *(undefined8 *)(in_RSI + 0x54) = local_38;
    }
    else {
      (**(code **)(*(long *)this_00->rightCornerWidget + 0x70))();
      in_stack_ffffffffffffff54 = QSize::width((QSize *)0x6e5df3);
      QSize::height((QSize *)0x6e5e04);
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
      QVar6 = QSize::boundedTo((QSize *)in_RDI,
                               (QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ));
      *(QSize *)(in_RSI + 0x54) = QVar6;
    }
    if ((this_00->leftCornerWidget == (QWidget *)0x0) ||
       (bVar2 = QWidget::isVisible((QWidget *)0x6e5e91), !bVar2)) {
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
      *(undefined8 *)(in_RSI + 0x5c) = local_58;
    }
    else {
      (**(code **)(*(long *)this_00->leftCornerWidget + 0x70))();
      in_stack_ffffffffffffff50 = QSize::width((QSize *)0x6e5ed3);
      QSize::height((QSize *)0x6e5ee4);
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
      QVar6 = QSize::boundedTo((QSize *)in_RDI,
                               (QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ));
      *(QSize *)(in_RSI + 0x5c) = QVar6;
    }
    *(undefined1 **)(in_RSI + 0x4c) = local_10;
    this_01 = (QRect *)tabBar((QTabWidget *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    tabBar((QTabWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QTabBar::currentIndex((QTabBar *)this_01);
    QVar7 = QTabBar::tabRect((QTabBar *)this_02,(int)((ulong)in_RSI >> 0x20));
    QRect::topLeft(this_01);
    QRect::topLeft(this_01);
    ::operator+((QPoint *)CONCAT44(uVar3,in_stack_ffffffffffffff60),(QPoint *)in_RDI);
    QRect::moveTopLeft((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (QPoint *)this_01);
    local_68 = QVar7._0_8_;
    *(undefined8 *)(in_RSI + 0x74) = local_68;
    local_60 = QVar7._8_8_;
    *(undefined8 *)(in_RSI + 0x7c) = local_60;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabWidget::initStyleOption(QStyleOptionTabWidgetFrame *option) const
{
    if (!option)
        return;

    Q_D(const QTabWidget);
    d->initBasicStyleOption(option);

    int exth = style()->pixelMetric(QStyle::PM_TabBarBaseHeight, nullptr, this);
    QSize t(0, d->stack->frameWidth());
    if (d->tabs->isVisibleTo(const_cast<QTabWidget *>(this))) {
        t = d->tabs->sizeHint();
        if (documentMode()) {
            if (tabPosition() == East || tabPosition() == West) {
                t.setHeight(height());
            } else {
                t.setWidth(width());
            }
        }
    }

    if (d->rightCornerWidget && d->rightCornerWidget->isVisible()) {
        const QSize rightCornerSizeHint = d->rightCornerWidget->sizeHint();
        const QSize bounds(rightCornerSizeHint.width(), t.height() - exth);
        option->rightCornerWidgetSize = rightCornerSizeHint.boundedTo(bounds);
    } else {
        option->rightCornerWidgetSize = QSize(0, 0);
    }

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible()) {
        const QSize leftCornerSizeHint = d->leftCornerWidget->sizeHint();
        const QSize bounds(leftCornerSizeHint.width(), t.height() - exth);
        option->leftCornerWidgetSize = leftCornerSizeHint.boundedTo(bounds);
    } else {
        option->leftCornerWidgetSize = QSize(0, 0);
    }

    option->tabBarSize = t;

    QRect selectedTabRect = tabBar()->tabRect(tabBar()->currentIndex());
    selectedTabRect.moveTopLeft(selectedTabRect.topLeft() + option->tabBarRect.topLeft());
    option->selectedTabRect = selectedTabRect;
}